

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O1

string_view __thiscall
absl::lts_20250127::ByString::Find(ByString *this,string_view text,size_t pos)

{
  void *pvVar1;
  size_type __n;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  pcVar3 = text._M_str;
  uVar4 = text._M_len;
  __n = (this->delimiter_)._M_string_length;
  if (__n == 1) {
    uVar2 = 0xffffffffffffffff;
    if (pos <= uVar4 && uVar4 - pos != 0) {
      pvVar1 = memchr(pcVar3 + pos,(int)*(this->delimiter_)._M_dataplus._M_p,uVar4 - pos);
      uVar2 = -(ulong)(pvVar1 == (void *)0x0) | (long)pvVar1 - (long)pcVar3;
    }
    if (uVar2 != 0xffffffffffffffff) {
      if (uVar4 < uVar2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar2,uVar4);
      }
      __n = (size_type)(uVar2 != uVar4);
      pcVar3 = pcVar3 + uVar2;
      goto LAB_0023ff59;
    }
  }
  else {
    if (uVar4 == 0 || __n != 0) {
      local_28._M_len = uVar4;
      local_28._M_str = pcVar3;
      uVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&local_28,(this->delimiter_)._M_dataplus._M_p,pos,__n);
      if (uVar2 == 0xffffffffffffffff) {
        uVar2 = uVar4;
        __n = 0;
      }
      pcVar3 = pcVar3 + uVar2;
      goto LAB_0023ff59;
    }
    uVar4 = pos + 1;
  }
  pcVar3 = pcVar3 + uVar4;
  __n = 0;
LAB_0023ff59:
  sVar5._M_str = pcVar3;
  sVar5._M_len = __n;
  return sVar5;
}

Assistant:

absl::string_view ByString::Find(absl::string_view text, size_t pos) const {
  if (delimiter_.length() == 1) {
    // Much faster to call find on a single character than on an
    // absl::string_view.
    size_t found_pos = text.find(delimiter_[0], pos);
    if (found_pos == absl::string_view::npos)
      return absl::string_view(text.data() + text.size(), 0);
    return text.substr(found_pos, 1);
  }
  return GenericFind(text, delimiter_, pos, LiteralPolicy());
}